

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynCallArgument * ParseCallArgument(ParseContext *ctx)

{
  Lexeme *begin;
  int iVar1;
  undefined4 extraout_var;
  Lexeme *pLVar2;
  Lexeme *end;
  SynBase *value;
  undefined4 extraout_var_00;
  SynCallArgument *this_00;
  undefined4 extraout_var_02;
  InplaceStr name;
  SynIdentifier *this;
  undefined4 extraout_var_01;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_string) {
    name = ParseContext::Consume(ctx);
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    this = (SynIdentifier *)CONCAT44(extraout_var,iVar1);
    pLVar2 = ParseContext::Previous(ctx);
    end = ParseContext::Previous(ctx);
    SynIdentifier::SynIdentifier(this,pLVar2,end,name);
    if (ctx->currentLexeme->type == lex_colon) {
      ctx->currentLexeme = ctx->currentLexeme + 1;
      value = ParseAssignment(ctx);
      if (value == (SynBase *)0x0) {
        anon_unknown.dwarf_147a9::Report
                  (ctx,ctx->currentLexeme,
                   "ERROR: expression not found after \':\' in function argument list");
        iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        value = (SynBase *)CONCAT44(extraout_var_00,iVar1);
        SynError::SynError((SynError *)value,ctx->currentLexeme,ctx->currentLexeme);
      }
      iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      this_00 = (SynCallArgument *)CONCAT44(extraout_var_01,iVar1);
      pLVar2 = ParseContext::Previous(ctx);
      goto LAB_001131aa;
    }
    ctx->currentLexeme = begin;
  }
  value = ParseAssignment(ctx);
  if (value == (SynBase *)0x0) {
    return (SynCallArgument *)0x0;
  }
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
  this_00 = (SynCallArgument *)CONCAT44(extraout_var_02,iVar1);
  pLVar2 = ParseContext::Previous(ctx);
  this = (SynIdentifier *)0x0;
LAB_001131aa:
  SynCallArgument::SynCallArgument(this_00,begin,pLVar2,this,value);
  return this_00;
}

Assistant:

SynCallArgument* ParseCallArgument(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.At(lex_string))
	{
		InplaceStr name = ctx.Consume();
		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);

		if(ctx.Consume(lex_colon))
		{
			SynBase *value = ParseAssignment(ctx);

			if(!value)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after ':' in function argument list");

				value = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}

			return new (ctx.get<SynCallArgument>()) SynCallArgument(start, ctx.Previous(), nameIdentifier, value);
		}
		else
		{
			// Backtrack
			ctx.currentLexeme = start;
		}
	}

	if(SynBase *value = ParseAssignment(ctx))
	{
		return new (ctx.get<SynCallArgument>()) SynCallArgument(start, ctx.Previous(), NULL, value);
	}

	return NULL;
}